

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TextureCubeMipmapCase::TextureCubeMipmapCase
          (TextureCubeMipmapCase *this,TestContext *testCtx,RenderContext *renderCtx,
          ContextInfo *renderCtxInfo,char *name,char *desc,CoordType coordType,deUint32 minFilter,
          deUint32 wrapS,deUint32 wrapT,deUint32 format,deUint32 dataType,int size)

{
  TestLog *log;
  uint uVar1;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeMipmapCase_0078cca8;
  this->m_renderCtx = renderCtx;
  this->m_renderCtxInfo = renderCtxInfo;
  this->m_coordType = coordType;
  this->m_minFilter = minFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_format = format;
  this->m_dataType = dataType;
  this->m_size = size;
  this->m_texture = (TextureCube *)0x0;
  log = testCtx->m_log;
  uVar1 = (*renderCtxInfo->_vptr_ContextInfo[7])(renderCtxInfo);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,log,GLSL_VERSION_100_ES,(uVar1 & 0xff) + PRECISION_MEDIUMP)
  ;
  return;
}

Assistant:

TextureCubeMipmapCase::TextureCubeMipmapCase (tcu::TestContext&			testCtx,
											  glu::RenderContext&		renderCtx,
											  const glu::ContextInfo&	renderCtxInfo,
											  const char*				name,
											  const char*				desc,
											  CoordType					coordType,
											  deUint32					minFilter,
											  deUint32					wrapS,
											  deUint32					wrapT,
											  deUint32					format,
											  deUint32					dataType,
											  int						size)
	: TestCase			(testCtx, name, desc)
	, m_renderCtx		(renderCtx)
	, m_renderCtxInfo	(renderCtxInfo)
	, m_coordType		(coordType)
	, m_minFilter		(minFilter)
	, m_wrapS			(wrapS)
	, m_wrapT			(wrapT)
	, m_format			(format)
	, m_dataType		(dataType)
	, m_size			(size)
	, m_texture			(DE_NULL)
	, m_renderer		(renderCtx, testCtx.getLog(), glu::GLSL_VERSION_100_ES,
						 renderCtxInfo.isFragmentHighPrecisionSupported() ? glu::PRECISION_HIGHP // Use highp if available.
																		  : glu::PRECISION_MEDIUMP)
{
}